

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O3

PoolItem * __thiscall soul::PoolAllocator::allocateSpaceForObject(PoolAllocator *this,size_t size)

{
  char *pcVar1;
  Pool *pPVar2;
  size_t sVar3;
  PoolItem *pPVar4;
  ulong uVar5;
  ulong uVar6;
  
  pPVar2 = this->currentPool;
  sVar3 = pPVar2->nextSlot;
  uVar6 = size + 0x1f & 0xfffffffffffffff0;
  uVar5 = sVar3 + uVar6;
  if (0xffe0 < uVar5) {
    pPVar2 = (Pool *)operator_new(0xfff0);
    pPVar2->nextSlot = 0;
    this->currentPool = pPVar2;
    std::
    vector<std::unique_ptr<soul::PoolAllocator::Pool,std::default_delete<soul::PoolAllocator::Pool>>,std::allocator<std::unique_ptr<soul::PoolAllocator::Pool,std::default_delete<soul::PoolAllocator::Pool>>>>
    ::emplace_back<soul::PoolAllocator::Pool*&>
              ((vector<std::unique_ptr<soul::PoolAllocator::Pool,std::default_delete<soul::PoolAllocator::Pool>>,std::allocator<std::unique_ptr<soul::PoolAllocator::Pool,std::default_delete<soul::PoolAllocator::Pool>>>>
                *)this,&this->currentPool);
    pPVar2 = this->currentPool;
    sVar3 = pPVar2->nextSlot;
    uVar5 = sVar3 + uVar6;
    if (0xffe0 < uVar5) {
      throwInternalCompilerError("currentPool->hasSpaceFor (size)","allocateSpaceForObject",0x14b);
    }
  }
  pPVar4 = (PoolItem *)((pPVar2->space)._M_elems + sVar3);
  pPVar4->size = uVar6;
  pcVar1 = (pPVar2->space)._M_elems + sVar3 + 8;
  pcVar1[0] = '\0';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  pcVar1[4] = '\0';
  pcVar1[5] = '\0';
  pcVar1[6] = '\0';
  pcVar1[7] = '\0';
  pPVar2->nextSlot = uVar5;
  return pPVar4;
}

Assistant:

PoolItem& allocateSpaceForObject (size_t size)
    {
        if (! currentPool->hasSpaceFor (size))
        {
            addNewPool();
            SOUL_ASSERT (currentPool->hasSpaceFor (size));
        }

        return currentPool->createItem (size);
    }